

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnLayerSupportVectorMachine.cpp
# Opt level: O3

bool __thiscall tfs::DnnLayerSupportVectorMachine::runForward(DnnLayerSupportVectorMachine *this)

{
  Matrix *pMVar1;
  double *__src;
  Matrix *pMVar2;
  double *__dest;
  size_t __n;
  bool bVar3;
  
  pMVar1 = (this->super_DnnLayer).m_in_a;
  if (((((pMVar1 != (Matrix *)0x0) && (__src = pMVar1->m_data, __src != (double *)0x0)) &&
       (__src <= pMVar1->m_end)) &&
      ((pMVar2 = (this->super_DnnLayer).m_out_a, pMVar2 != (Matrix *)0x0 &&
       (__dest = pMVar2->m_data, __dest != (double *)0x0)))) && (__dest <= pMVar2->m_end)) {
    __n = pMVar2->m_length;
    if ((__n != 0) && (__n == pMVar1->m_length)) {
      memcpy(__dest,__src,__n);
    }
    return true;
  }
  bVar3 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnLayerSupportVectorMachine.cpp"
                         ,"runForward",0x1c,"Not configured");
  return bVar3;
}

Assistant:

bool
    DnnLayerSupportVectorMachine::runForward(  void ) {
        // -----------------------------------------------------------------------------------
        // virtual: Forward propagate, used with forward()
        // -----------------------------------------------------------------------------------
        if( matrixBad( m_in_a ) || matrixBad( m_out_a )) {
            return log_error( "Not configured" );
        }
        m_out_a->copy( *m_in_a );   // Simple identity
        return true;
    }